

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

State * __thiscall despot::Chain::CreateStartState(Chain *this,string *type)

{
  bool bVar1;
  State *pSVar2;
  ostream *poVar3;
  char *pcVar4;
  
  bVar1 = std::operator==(type,"DEFAULT");
  if (bVar1) {
    pSVar2 = DefaultStartState(this);
    return pSVar2;
  }
  bVar1 = std::operator==(type,"FULL");
  if (bVar1) {
    pcVar4 = "Initial belief type to be supported: ";
  }
  else {
    pcVar4 = "Unsupported initial belief type: ";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(0);
}

Assistant:

State* Chain::CreateStartState(string type) const {
	State* start = NULL;
	if (type == "DEFAULT") {
		start = DefaultStartState();
	} else if (type == "FULL") {
		cerr << "Initial belief type to be supported: " << type << endl;
		exit(0);
		//return ExactPrior(NULL)->Sample(1)[0];
	} else {
		cerr << "Unsupported initial belief type: " << type << endl;
		exit(0);
	}
	return start;
}